

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O2

FT_Error TT_Load_Simple_Glyph(TT_Loader load)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  FT_GlyphLoader loader;
  byte *pbVar5;
  FT_GlyphSlot pFVar6;
  TT_ExecContext pTVar7;
  FT_Byte *__dest;
  bool bVar8;
  ushort uVar9;
  FT_Error FVar10;
  FT_Error FVar11;
  ushort *puVar12;
  ushort *puVar13;
  FT_Vector *pFVar14;
  ushort *puVar15;
  byte *pbVar16;
  FT_Vector *pFVar17;
  FT_UInt n_contours;
  ushort uVar18;
  ulong uVar19;
  char cVar20;
  byte *pbVar21;
  FT_Vector *pFVar22;
  int iVar23;
  ulong uVar24;
  byte *pbVar25;
  byte *pbVar26;
  long lVar27;
  FT_ULong tmp;
  
  loader = load->gloader;
  pbVar26 = load->cursor;
  pbVar5 = load->limit;
  sVar4 = load->n_contours;
  n_contours = (FT_UInt)sVar4;
  if (sVar4 == 0) {
    puVar12 = (ushort *)(loader->current).outline.contours;
    puVar15 = puVar12;
  }
  else {
    if ((loader->max_contours <
         (int)(loader->base).outline.n_contours + n_contours +
         (int)(loader->current).outline.n_contours) &&
       (FVar10 = FT_GlyphLoader_CheckPoints(loader,0,n_contours), FVar10 != 0)) {
      return FVar10;
    }
    if (0xffe < sVar4) {
      return 0x14;
    }
    puVar12 = (ushort *)(loader->current).outline.contours;
    puVar15 = puVar12 + (int)n_contours;
  }
  if (pbVar5 < pbVar26 + (long)(int)n_contours * 2 + 2) {
    return 0x14;
  }
  bVar2 = *pbVar26;
  uVar9 = CONCAT11(bVar2,pbVar26[1]);
  if (0 < sVar4) {
    *puVar12 = uVar9;
  }
  if ((short)((ushort)bVar2 << 8) < 0) {
    return 0x14;
  }
  pbVar25 = pbVar26 + 4;
  pbVar26 = pbVar5 + (-4 - (long)pbVar26);
  while (puVar13 = puVar12 + 1, puVar13 < puVar15) {
    uVar18 = *(ushort *)(pbVar25 + -2) << 8 | *(ushort *)(pbVar25 + -2) >> 8;
    *puVar13 = uVar18;
    pbVar25 = pbVar25 + 2;
    pbVar26 = pbVar26 + -2;
    bVar8 = (short)uVar18 <= (short)uVar9;
    puVar12 = puVar13;
    uVar9 = uVar18;
    if (bVar8) {
      return 0x14;
    }
  }
  if (sVar4 < 1) {
    uVar24 = 0;
  }
  else {
    if ((short)*puVar12 < -1) {
      return 0x14;
    }
    uVar24 = (ulong)((int)(short)*puVar12 + 1);
  }
  iVar23 = (int)uVar24;
  if ((loader->max_points <
       (uint)((loader->base).outline.n_points + iVar23 + 4 + (int)(loader->current).outline.n_points
             )) && (FVar10 = FT_GlyphLoader_CheckPoints(loader,iVar23 + 4,0), FVar10 != 0)) {
    return FVar10;
  }
  FVar10 = 0x14;
  pFVar6 = load->glyph;
  pFVar6->control_data = (void *)0x0;
  pFVar6->control_len = 0;
  if (pbVar5 < pbVar25) {
    return 0x14;
  }
  uVar9 = *(ushort *)(pbVar25 + -2) << 8 | *(ushort *)(pbVar25 + -2) >> 8;
  uVar19 = (ulong)uVar9;
  if ((load->load_flags & 2) == 0) {
    if ((long)pbVar26 < (long)uVar19) {
      return 0x16;
    }
    pTVar7 = load->exec;
    tmp = (FT_ULong)pTVar7->glyphSize;
    FVar11 = Update_Max(pTVar7->memory,&tmp,1,&pTVar7->glyphIns,uVar19);
    pTVar7 = load->exec;
    pTVar7->glyphSize = (FT_UInt)tmp;
    if (FVar11 != 0) {
      return FVar11;
    }
    pFVar6 = load->glyph;
    pFVar6->control_len = uVar19;
    __dest = pTVar7->glyphIns;
    pFVar6->control_data = __dest;
    if (uVar9 != 0) {
      memcpy(__dest,pbVar25,uVar19);
    }
  }
  pbVar16 = (byte *)(loader->current).outline.tags;
  pbVar21 = pbVar16 + uVar24;
  pbVar26 = pbVar25 + uVar19;
  while( true ) {
    do {
      pbVar25 = pbVar26;
      if (pbVar21 <= pbVar16) {
        pbVar26 = (byte *)(loader->current).outline.tags;
        if ((iVar23 != 0) && ((*pbVar26 & 0x40) != 0)) {
          piVar1 = &(loader->base).outline.flags;
          *(byte *)piVar1 = (byte)*piVar1 | 0x40;
        }
        if (pbVar25 <= pbVar5) {
          pFVar17 = (loader->current).outline.points;
          pFVar14 = pFVar17 + uVar24;
          lVar27 = 0;
          pbVar21 = pbVar26;
          for (pFVar22 = pFVar17; pFVar22 < pFVar14; pFVar22 = pFVar22 + 1) {
            bVar2 = *pbVar21;
            if ((bVar2 & 2) == 0) {
              if ((bVar2 & 0x10) == 0) {
                if (pbVar5 < pbVar25 + 2) {
                  return 0x14;
                }
                uVar19 = (long)(short)((ushort)*pbVar25 << 8) | (ulong)pbVar25[1];
                pbVar25 = pbVar25 + 2;
              }
              else {
                uVar19 = 0;
              }
            }
            else {
              pbVar16 = pbVar25 + 1;
              if (pbVar5 < pbVar16) {
                return 0x14;
              }
              bVar3 = *pbVar25;
              uVar19 = -(ulong)bVar3;
              pbVar25 = pbVar16;
              if ((bVar2 & 0x10) != 0) {
                uVar19 = (ulong)bVar3;
              }
            }
            lVar27 = lVar27 + uVar19;
            pFVar22->x = lVar27;
            pbVar21 = pbVar21 + 1;
          }
          lVar27 = 0;
          for (; pFVar17 < pFVar14; pFVar17 = pFVar17 + 1) {
            bVar2 = *pbVar26;
            if ((bVar2 & 4) == 0) {
              if ((bVar2 & 0x20) == 0) {
                if (pbVar5 < pbVar25 + 2) {
                  return 0x14;
                }
                uVar19 = (long)(short)((ushort)*pbVar25 << 8) | (ulong)pbVar25[1];
                pbVar25 = pbVar25 + 2;
              }
              else {
                uVar19 = 0;
              }
            }
            else {
              pbVar21 = pbVar25 + 1;
              if (pbVar5 < pbVar21) {
                return 0x14;
              }
              bVar3 = *pbVar25;
              uVar19 = -(ulong)bVar3;
              pbVar25 = pbVar21;
              if ((bVar2 & 0x20) != 0) {
                uVar19 = (ulong)bVar3;
              }
            }
            lVar27 = lVar27 + uVar19;
            pFVar17->y = lVar27;
            *pbVar26 = bVar2 & 1;
            pbVar26 = pbVar26 + 1;
          }
          (loader->current).outline.n_points = (short)uVar24;
          (loader->current).outline.n_contours = sVar4;
          load->cursor = pbVar25;
          FVar10 = 0;
        }
        return FVar10;
      }
      pbVar26 = pbVar25 + 1;
      if (pbVar5 < pbVar26) {
        return 0x14;
      }
      bVar2 = *pbVar25;
      *pbVar16 = bVar2;
      pbVar16 = pbVar16 + 1;
    } while ((bVar2 & 8) == 0);
    if (pbVar5 < pbVar25 + 2) {
      return 0x14;
    }
    uVar19 = (ulong)*pbVar26;
    if (pbVar21 < pbVar16 + uVar19) break;
    while (cVar20 = (char)uVar19, uVar19 = (ulong)(byte)(cVar20 - 1), pbVar26 = pbVar25 + 2,
          cVar20 != '\0') {
      *pbVar16 = bVar2;
      pbVar16 = pbVar16 + 1;
    }
  }
  return 0x14;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Simple_Glyph( TT_Loader  load )
  {
    FT_Error        error;
    FT_Byte*        p          = load->cursor;
    FT_Byte*        limit      = load->limit;
    FT_GlyphLoader  gloader    = load->gloader;
    FT_Int          n_contours = load->n_contours;
    FT_Outline*     outline;
    FT_UShort       n_ins;
    FT_Int          n_points;

    FT_Byte         *flag, *flag_limit;
    FT_Byte         c, count;
    FT_Vector       *vec, *vec_limit;
    FT_Pos          x, y;
    FT_Short        *cont, *cont_limit, prev_cont;
    FT_Int          xy_size = 0;


    /* check that we can add the contours to the glyph */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, 0, n_contours );
    if ( error )
      goto Fail;

    /* reading the contours' endpoints & number of points */
    cont       = gloader->current.outline.contours;
    cont_limit = cont + n_contours;

    /* check space for contours array + instructions count */
    if ( n_contours >= 0xFFF || p + ( n_contours + 1 ) * 2 > limit )
      goto Invalid_Outline;

    prev_cont = FT_NEXT_SHORT( p );

    if ( n_contours > 0 )
      cont[0] = prev_cont;

    if ( prev_cont < 0 )
      goto Invalid_Outline;

    for ( cont++; cont < cont_limit; cont++ )
    {
      cont[0] = FT_NEXT_SHORT( p );
      if ( cont[0] <= prev_cont )
      {
        /* unordered contours: this is invalid */
        goto Invalid_Outline;
      }
      prev_cont = cont[0];
    }

    n_points = 0;
    if ( n_contours > 0 )
    {
      n_points = cont[-1] + 1;
      if ( n_points < 0 )
        goto Invalid_Outline;
    }

    FT_TRACE5(( "  # of points: %d\n", n_points ));

    /* note that we will add four phantom points later */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, n_points + 4, 0 );
    if ( error )
      goto Fail;

    /* reading the bytecode instructions */
    load->glyph->control_len  = 0;
    load->glyph->control_data = NULL;

    if ( p + 2 > limit )
      goto Invalid_Outline;

    n_ins = FT_NEXT_USHORT( p );

    FT_TRACE5(( "  Instructions size: %u\n", n_ins ));

#ifdef TT_USE_BYTECODE_INTERPRETER

    if ( IS_HINTED( load->load_flags ) )
    {
      FT_ULong  tmp;


      /* check instructions size */
      if ( ( limit - p ) < n_ins )
      {
        FT_TRACE1(( "TT_Load_Simple_Glyph: instruction count mismatch\n" ));
        error = FT_THROW( Too_Many_Hints );
        goto Fail;
      }

      /* we don't trust `maxSizeOfInstructions' in the `maxp' table */
      /* and thus update the bytecode array size by ourselves       */

      tmp   = load->exec->glyphSize;
      error = Update_Max( load->exec->memory,
                          &tmp,
                          sizeof ( FT_Byte ),
                          (void*)&load->exec->glyphIns,
                          n_ins );

      load->exec->glyphSize = (FT_UInt)tmp;
      if ( error )
        return error;

      load->glyph->control_len  = n_ins;
      load->glyph->control_data = load->exec->glyphIns;

      if ( n_ins )
        FT_MEM_COPY( load->exec->glyphIns, p, (FT_Long)n_ins );
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    p += n_ins;

    outline = &gloader->current.outline;

    /* reading the point tags */
    flag       = (FT_Byte*)outline->tags;
    flag_limit = flag + n_points;

    FT_ASSERT( flag );

    while ( flag < flag_limit )
    {
      if ( p + 1 > limit )
        goto Invalid_Outline;

      *flag++ = c = FT_NEXT_BYTE( p );
      if ( c & REPEAT_FLAG )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        count = FT_NEXT_BYTE( p );
        if ( flag + (FT_Int)count > flag_limit )
          goto Invalid_Outline;

        for ( ; count > 0; count-- )
          *flag++ = c;
      }
    }

    /* retain the overlap flag */
    if ( n_points && outline->tags[0] & OVERLAP_SIMPLE )
      gloader->base.outline.flags |= FT_OUTLINE_OVERLAP;

    /* reading the X coordinates */

    vec       = outline->points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    if ( p + xy_size > limit )
      goto Invalid_Outline;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   delta = 0;
      FT_Byte  f     = *flag;


      if ( f & X_SHORT_VECTOR )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_BYTE( p );
        if ( !( f & X_POSITIVE ) )
          delta = -delta;
      }
      else if ( !( f & SAME_X ) )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += delta;
      vec->x = x;
    }

    /* reading the Y coordinates */

    vec       = gloader->current.outline.points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    y         = 0;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   delta = 0;
      FT_Byte  f     = *flag;


      if ( f & Y_SHORT_VECTOR )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_BYTE( p );
        if ( !( f & Y_POSITIVE ) )
          delta = -delta;
      }
      else if ( !( f & SAME_Y ) )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        delta = (FT_Pos)FT_NEXT_SHORT( p );
      }

      y     += delta;
      vec->y = y;

      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & ON_CURVE_POINT );
    }

    outline->n_points   = (FT_Short)n_points;
    outline->n_contours = (FT_Short)n_contours;

    load->cursor = p;

  Fail:
    return error;

  Invalid_Outline:
    error = FT_THROW( Invalid_Outline );
    goto Fail;
  }